

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkInitialState(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pMan;
  ulong uVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    uVar1 = (long)pNtk->vPis->nSize / 2;
    pAVar2 = (Abc_Obj_t *)0x3;
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pFanin = Abc_AigConst1(pNtk_00);
    uVar5 = 0;
    uVar4 = uVar1 & 0xffffffff;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    while (i = (int)uVar5, (int)uVar4 != i) {
      pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar2 = Abc_NtkPi(pNtk_00,i);
      pAVar3 = Abc_AigAnd(pMan,pFanin,(Abc_Obj_t *)((ulong)pAVar2 ^ 1));
      pAVar2 = pFanin;
      pFanin = pAVar3;
      uVar5 = (ulong)(i + 1);
    }
    pAVar2 = Abc_NtkPo(pNtk_00,(int)pAVar2);
    Abc_ObjAddFanin(pAVar2,pFanin);
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                ,0x10a,"Abc_Ntk_t *Abc_NtkInitialState(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkInitialState( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // compute the all-zero state in terms of the CS variables
    pMiter = Abc_AigConst1(pNtkNew);
    for ( i = 0; i < nVars; i++ )
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pMiter, Abc_ObjNot( Abc_NtkPi(pNtkNew, i) ) );
    // add the PO
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}